

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O2

void __thiscall cpptempl::TokenIf::gettext(TokenIf *this,ostream *stream,data_map *data)

{
  pointer psVar1;
  long *plVar2;
  bool bVar3;
  long lVar4;
  size_t j;
  ulong uVar5;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,(string *)&this->m_expr);
  bVar3 = is_true(this,&local_50,data);
  std::__cxx11::string::~string((string *)&local_50);
  if (bVar3) {
    lVar4 = 0;
    uVar5 = 0;
    while( true ) {
      psVar1 = (this->m_children).
               super__Vector_base<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->m_children).
                        super__Vector_base<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4) <= uVar5)
      break;
      plVar2 = *(long **)((long)&(psVar1->
                                 super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>).
                                 _M_ptr + lVar4);
      (**(code **)(*plVar2 + 8))(plVar2,stream,data);
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x10;
    }
  }
  return;
}

Assistant:

inline void TokenIf::gettext( std::ostream &stream, data_map &data )
    {
        if (is_true(m_expr, data))
        {
            for(size_t j = 0 ; j < m_children.size() ; ++j)
            {
                m_children[j]->gettext(stream, data) ;
            }
        }
    }